

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcConfigList.cpp
# Opt level: O2

void glcts::getDefaultConfigList(Platform *platform,ApiType type,ConfigList *configList)

{
  Config local_2c;
  
  getConfigListEGL(platform,type,configList);
  getConfigListWGL(platform,type,configList);
  if ((configList->configs).super__Vector_base<glcts::Config,_std::allocator<glcts::Config>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (configList->configs).super__Vector_base<glcts::Config,_std::allocator<glcts::Config>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    qpPrintf("Warning: No configs enumerated, adding only default config!\n");
    local_2c.type = CONFIGTYPE_DEFAULT;
    local_2c.id = 0;
    local_2c.surfaceTypes = 1;
    std::vector<glcts::Config,_std::allocator<glcts::Config>_>::emplace_back<glcts::Config>
              (&configList->configs,&local_2c);
  }
  return;
}

Assistant:

void getDefaultConfigList(tcu::Platform& platform, glu::ApiType type, ConfigList& configList)
{
	try
	{
		getConfigListEGL(platform, type, configList);
	}
	catch (const std::exception& e)
	{
		qpPrintf("No EGL configs enumerated: %s\n", e.what());
	}

	try
	{
		getConfigListWGL(platform, type, configList);
	}
	catch (const std::exception& e)
	{
		qpPrintf("No WGL configs enumerated: %s\n", e.what());
	}

	if (configList.configs.empty())
	{
		qpPrintf("Warning: No configs enumerated, adding only default config!\n");
		configList.configs.push_back(Config(CONFIGTYPE_DEFAULT, 0, SURFACETYPE_WINDOW));
	}
}